

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointcheckpointscheme.c
# Opt level: O2

SUNErrCode SUNAdjointCheckpointScheme_Destroy(SUNAdjointCheckpointScheme_conflict *check_scheme_ptr)

{
  SUNAdjointCheckpointSchemeDestroyFn UNRECOVERED_JUMPTABLE;
  SUNErrCode SVar1;
  
  UNRECOVERED_JUMPTABLE = (*check_scheme_ptr)->ops->destroy;
  if (UNRECOVERED_JUMPTABLE != (SUNAdjointCheckpointSchemeDestroyFn)0x0) {
    SVar1 = (*UNRECOVERED_JUMPTABLE)(check_scheme_ptr);
    return SVar1;
  }
  free((*check_scheme_ptr)->ops);
  free(*check_scheme_ptr);
  return 0;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_Destroy(
  SUNAdjointCheckpointScheme* check_scheme_ptr)
{
  SUNFunctionBegin((*check_scheme_ptr)->sunctx);
  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);
  if ((*check_scheme_ptr)->ops->destroy)
  {
    SUNErrCode err = (*check_scheme_ptr)->ops->destroy(check_scheme_ptr);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }
  else if (*check_scheme_ptr)
  {
    free((*check_scheme_ptr)->ops);
    free(*check_scheme_ptr);
  }
  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_SUCCESS;
}